

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,call_expression *e)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  uint *puVar5;
  wostream *pwVar6;
  native_error_exception *this_00;
  object_ptr o;
  vector<mjs::value,_std::allocator<mjs::value>_> args;
  value mval;
  auto_stack_update asu;
  wstring local_290;
  wstring_view local_270;
  vector<mjs::value,_std::allocator<mjs::value>_> local_260;
  wchar_t *local_248;
  size_t local_240;
  value local_228;
  undefined1 local_200 [80];
  wstring_view local_1b0;
  undefined1 local_1a0 [376];
  
  eval_call_member((tuple<mjs::value,_mjs::value> *)local_200,this,
                   (e->member_)._M_t.
                   super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                   super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
  get_value(&local_228,this,(value *)(local_200 + 0x28));
  eval_argument_list(&local_260,this,&e->arguments_);
  if (local_228.type_ == object) {
    pvVar3 = gc_heap_ptr_untyped::get(&(this->global_).super_gc_heap_ptr_untyped);
    iVar2 = *(int *)((long)pvVar3 + 0x20);
    this->was_direct_call_to_eval_ = iVar2 < 2;
    if ((local_200._0_4_ == undefined) && (local_200._40_4_ == reference)) {
      local_290._M_dataplus._M_p = (pointer)local_200._48_8_;
      local_290._M_string_length._0_4_ = local_200._56_4_;
      if ((gc_heap *)local_200._48_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_200._48_8_,(gc_heap_ptr_untyped *)&local_290);
      }
      if ((gc_heap *)local_290._M_dataplus._M_p != (gc_heap *)0x0) {
        bVar1 = gc_heap_ptr_untyped::has_type<mjs::activation_object>
                          ((gc_heap_ptr_untyped *)&local_290);
        if (!bVar1) {
          bVar1 = is_global_object((object_ptr *)&local_290);
          if (!bVar1) {
            local_1a0._0_4_ = object;
            local_1a0._8_8_ = local_290._M_dataplus._M_p;
            local_1a0._16_4_ = (uint32_t)local_290._M_string_length;
            if ((gc_heap *)local_290._M_dataplus._M_p != (gc_heap *)0x0) {
              gc_heap::attach((gc_heap *)local_290._M_dataplus._M_p,
                              (gc_heap_ptr_untyped *)(local_1a0 + 8));
            }
            value::operator=((value *)local_200,(value *)local_1a0);
            value::destroy((value *)local_1a0);
          }
        }
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_290);
      if (1 < iVar2) {
        piVar4 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_200 + 0x40));
        if (*piVar4 == 4) {
          iVar2 = wmemcmp(piVar4 + 1,L"eval",4);
          if (iVar2 == 0) {
            this->was_direct_call_to_eval_ = true;
          }
        }
      }
    }
    auto_stack_update::auto_stack_update
              ((auto_stack_update *)local_1a0,this,&(e->super_expression).super_syntax_node.extend_)
    ;
    call_function(__return_storage_ptr__,&local_228,(value *)local_200,&local_260);
    auto_stack_update::~auto_stack_update((auto_stack_update *)local_1a0);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_260);
    value::destroy(&local_228);
    value::destroy((value *)(local_200 + 0x28));
    value::destroy((value *)local_200);
    return __return_storage_ptr__;
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a0);
  to_string((mjs *)&local_290,this->heap_,&local_228);
  puVar5 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_290);
  pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     ((wostream *)local_1a0,(wchar_t *)(puVar5 + 1),(ulong)*puVar5);
  std::operator<<(pwVar6," is not a function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_290);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_290,this);
  local_270._M_str = local_290._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1b0._M_len = local_240;
  local_1b0._M_str = local_248;
  native_error_exception::native_error_exception(this_00,type,&local_270,&local_1b0);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

value operator()(const call_expression& e) {
        // 11.2.3 The order of these two steps are actually reversed prior to ES5, but it's unlikely to be observable
        auto [member, this_] = eval_call_member(e.member());
        auto mval = get_value(member);
        auto args = eval_argument_list(e.arguments());
        if (mval.type() != value_type::object) {
            std::wostringstream woss;
            woss << to_string(heap_, mval).view() << " is not a function";
            throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
        }
        // See ES5.1, 10.4.2 and 15.1.2.1.1
        const bool is_es5_or_later = global_->language_version() >= version::es5;
        was_direct_call_to_eval_ = !is_es5_or_later;
        if (this_.type() == value_type::undefined && member.type() == value_type::reference) {
            const auto& ref = member.reference_value();
            if (auto o = ref.base(); o && !o.has_type<activation_object>() && !is_global_object(o)) {
                this_ = value{o};
            }
            if (is_es5_or_later && ref.property_name().view() == L"eval") {
                // Meh, may need extra/better check
                was_direct_call_to_eval_ = true;
            }
        }

        auto_stack_update asu{*this, e.extend()};
        return call_function(mval, this_, args);
    }